

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.h
# Opt level: O3

void __thiscall NaPNStatistics::~NaPNStatistics(NaPNStatistics *this)

{
  *(code **)this = NaNNUnit::operator=;
  NaVector::~NaVector((NaVector *)(this + 0x1b0));
  NaVector::~NaVector((NaVector *)(this + 0x198));
  NaVector::~NaVector((NaVector *)(this + 0x170));
  NaVector::~NaVector((NaVector *)(this + 0x158));
  NaVector::~NaVector((NaVector *)(this + 0x140));
  NaVector::~NaVector((NaVector *)(this + 0x128));
  NaVector::~NaVector((NaVector *)(this + 0x110));
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(this + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x48));
  NaPetriNode::~NaPetriNode((NaPetriNode *)this);
  return;
}

Assistant:

class PNNA_API NaPNStatistics : public NaPetriNode
{
public:

  // Create node for Petri network
  NaPNStatistics (const char* szNodeName = "statistics");


  ////////////////
  // Connectors //
  ////////////////

  // Input (mainstream)
  NaPetriCnInput	signal;

  // Output vector (see configure_output() and NaSM_* macros):
  //  [0] absolute mean value: |S(x)/n|
  //  [1] mean value: S(x)/n
  //  [2] root mean square value: S(^2)/n
  //  [3] standard deviation value: S(^2)/n - (S(x)/n)^2
  //  [4] maximum value: Max(x)
  //  [5] minimum value: Min(x)
  //  [6] absolute maximum value: Max(|Max(x)|,|Min(x)|)
  //  [7] current time of statistics
  //  [8] index of the current time of statistics
  //  [9] input value to calculate statistics
  NaPetriCnOutput	stat;


  ///////////////////
  // Node specific //
  ///////////////////

  // Configure computation rule as continuos or floating gap
  void		set_floating_gap (unsigned gap_width);

  // Configure output values by string (delimiters may vary)
  void		configure_output (const char* szStatMask,
				  const char* szDelim = " ,;");

  // Configure output values by mask
  void		configure_output (int stat_mask = NaSM_ALL);

  // Setup net stop condition:
  // sign<0 --> stop if statistics value is less than value
  // sign=0 --> stop if statistics value is equal than value
  // sign>0 --> stop if statistics value is greater than value
  void		halt_condition (int stat_id, int sign, NaReal value);

  // Print statistics to the log (fp==NULL) or to the specified file stream.
  void		print_stat (const char* szTitle = NULL, FILE* fp = NULL);


  /////////////////////////
  // Computed statistics //
  /////////////////////////

  // Mean value: M(signal)
  NaVector	Mean;

  // Root mean square: M(signal^2)
  NaVector	RMS;

  // Standard deviation value: d(signal) = sqrt(M(signal^2) - M(signal)^2)
  NaVector	StdDev;

  // Minimum value of the series
  NaVector	Min;

  // Maximum value of the series
  NaVector	Max;



  ///////////////////////
  // Phases of network //
  ///////////////////////

  // 2. Link connectors inside the node
  virtual void	relate_connectors ();

  // 4. Allocate resources for internal usage
  virtual void	allocate_resources ();

  // 5. Verification to be sure all is OK (true)
  virtual bool	verify ();

  // 6. Initialize node activity and setup starter flag if needed
  virtual void	initialize (bool& starter);

  // 8. True action of the node (if activate returned true)
  virtual void	action ();

  // 9. Finish data processing by the node (if activate returned true)
  virtual void	post_action ();

private:

  // Check for given condition
  static bool	check_condition (NaReal stat, int sign, NaReal value);

  // Output mask
  int		mOutStat;

  // Computation gap width or 0 if floating
  unsigned	nGapWidth;

  // Counter of activations inside gap
  unsigned	nGapAct;

  /////////////////////////
  // Temporal statistics //
  /////////////////////////

  NaVector	Sum;
  NaVector	Sum2;

  /////////////////////////
  // Halt condition part //
  /////////////////////////

  int		mHalt;
  struct {
    int		sign;
    NaReal	value;
  }		HaltCond[NaSI_number];

}